

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void duckdb_fmt::v6::internal::
     handle_char_specs<char,duckdb_fmt::v6::internal::arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,duckdb_fmt::v6::internal::error_handler>::char_spec_handler>
               (basic_format_specs<char> *specs,char_spec_handler *handler)

{
  undefined8 uVar1;
  allocator local_31;
  string local_30 [32];
  
  if (specs != (basic_format_specs<char> *)0x0) {
    if ((specs->type != '\0') && (specs->type != 'c')) {
      arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
      ::char_spec_handler::on_int(handler);
      return;
    }
    if ((0xf < (byte)specs->field_0x9) || ((specs->field_0x9 & 0xf) == 4)) {
      std::__cxx11::string::string(local_30,"invalid format specifier for char",&local_31);
      uVar1 = duckdb_fmt::v6::internal::error_handler::on_error(handler,local_30);
      std::__cxx11::string::~string(local_30);
      _Unwind_Resume(uVar1);
    }
  }
  arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>::
  char_spec_handler::on_char(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_char_specs(const basic_format_specs<Char>* specs,
                                     Handler&& handler) {
  if (!specs) return handler.on_char();
  if (specs->type && specs->type != 'c') return handler.on_int();
  if (specs->align == align::numeric || specs->sign != sign::none || specs->alt)
    handler.on_error("invalid format specifier for char");
  handler.on_char();
}